

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_6d004::SharedLibraryShellCommand::getShortDescription
          (SharedLibraryShellCommand *this,SmallVectorImpl<char> *result)

{
  StringRef Str;
  size_t in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  raw_ostream local_48;
  SmallVectorImpl<char> *local_20;
  
  local_20 = result;
  if ((this->super_ExternalCommand).description._M_string_length == 0) {
    local_48.BufferMode = InternalBuffer;
    local_48.OutBufStart = (char *)0x0;
    local_48.OutBufEnd = (char *)0x0;
    local_48.OutBufCur = (char *)0x0;
    local_48._vptr_raw_ostream = (_func_int **)&PTR__raw_ostream_001e13d0;
    llvm::raw_ostream::SetUnbuffered(&local_48);
    std::operator+(&local_68,"Creating Shared library: ",&this->sharedLibName);
    llvm::raw_ostream::write
              (&local_48,(int)local_68._M_dataplus._M_p,(void *)local_68._M_string_length,in_RCX);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_48.BufferMode = InternalBuffer;
    local_48.OutBufStart = (char *)0x0;
    local_48.OutBufEnd = (char *)0x0;
    local_48.OutBufCur = (char *)0x0;
    local_48._vptr_raw_ostream = (_func_int **)&PTR__raw_ostream_001e13d0;
    llvm::raw_ostream::SetUnbuffered(&local_48);
    Str.Data = (this->super_ExternalCommand).description._M_dataplus._M_p;
    Str.Length = (this->super_ExternalCommand).description._M_string_length;
    llvm::raw_ostream::operator<<(&local_48,Str);
  }
  llvm::raw_ostream::~raw_ostream(&local_48);
  return;
}

Assistant:

virtual void
  getShortDescription(SmallVectorImpl<char>& result) const override {
    if (getDescription().empty()) {
      llvm::raw_svector_ostream(result)
          << "Creating Shared library: " + sharedLibName;
    } else {
      llvm::raw_svector_ostream(result) << getDescription();
    }
  }